

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

Raster * rw::d3d8::readAsImage
                   (Stream *stream,int32 width,int32 height,int32 depth,int32 format,int32 numLevels
                   )

{
  int iVar1;
  bool bVar2;
  int32 iVar3;
  uint local_480;
  int local_47c;
  int32 newformat;
  int x;
  uint8 *line;
  uint8 *puStack_468;
  int y;
  uint8 *pixels;
  uint8 *idx;
  uint32 size;
  int i_1;
  Raster *ras;
  Image *pIStack_440;
  int32 i;
  Image *img;
  uint8 *data;
  uint8 local_428 [4];
  int32 pallen;
  uint8 palette [1024];
  int32 numLevels_local;
  int32 format_local;
  int32 depth_local;
  int32 height_local;
  int32 width_local;
  Stream *stream_local;
  
  data._4_4_ = 0;
  img = (Image *)0x0;
  palette._1020_4_ = numLevels;
  numLevels_local = depth;
  format_local = height;
  depth_local = width;
  _height_local = stream;
  pIStack_440 = Image::create(width,height,0x20);
  Image::allocate(pIStack_440);
  if ((format & 0x4000U) == 0) {
    if ((format & 0x2000U) != 0) {
      data._4_4_ = 0x100;
      (*_height_local->_vptr_Stream[4])(_height_local,local_428,0x400);
    }
  }
  else {
    data._4_4_ = 0x10;
    (*_height_local->_vptr_Stream[4])(_height_local,local_428,0x80);
  }
  bVar2 = Raster::formatHasAlpha(format);
  if (!bVar2) {
    for (ras._4_4_ = 0; ras._4_4_ < data._4_4_; ras._4_4_ = ras._4_4_ + 1) {
      local_428[ras._4_4_ * 4 + 3] = 0xff;
    }
  }
  _size = (Raster *)0x0;
  for (idx._4_4_ = 0; idx._4_4_ < (int)palette._1020_4_; idx._4_4_ = idx._4_4_ + 1) {
    idx._0_4_ = Stream::readU32(_height_local);
    iVar1 = idx._4_4_;
    if ((_size == (Raster *)0x0) || (iVar3 = Raster::getNumLevels(_size), iVar1 < iVar3)) {
      if (img == (Image *)0x0) {
        img = (Image *)mustmalloc_LOC((ulong)(uint32)idx,0x10018,
                                      "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp line: 484"
                                     );
      }
      (*_height_local->_vptr_Stream[4])(_height_local,img,(ulong)(uint32)idx);
      if (_size != (Raster *)0x0) {
        Raster::lock(_size,idx._4_4_,5);
        pIStack_440->width = _size->width;
        pIStack_440->height = _size->height;
        pIStack_440->stride = pIStack_440->width * pIStack_440->bpp;
      }
      if ((format & 0x6000U) != 0) {
        pixels = (uint8 *)img;
        puStack_468 = pIStack_440->pixels;
        for (line._4_4_ = 0; line._4_4_ < pIStack_440->height; line._4_4_ = line._4_4_ + 1) {
          _newformat = puStack_468;
          for (local_47c = 0; local_47c < pIStack_440->width; local_47c = local_47c + 1) {
            *_newformat = local_428[(int)((uint)*pixels << 2)];
            _newformat[1] = local_428[(int)((uint)*pixels * 4 + 1)];
            _newformat[2] = local_428[(int)((uint)*pixels * 4 + 2)];
            _newformat[3] = local_428[(int)((uint)*pixels * 4 + 3)];
            _newformat = _newformat + pIStack_440->bpp;
            pixels = pixels + 1;
          }
          puStack_468 = puStack_468 + pIStack_440->stride;
        }
      }
      if (_size == (Raster *)0x0) {
        Raster::imageFindRasterFormat
                  (pIStack_440,format & 7,&depth_local,&format_local,&numLevels_local,
                   (int32 *)&local_480,0);
        local_480 = format & 0x9000U | local_480;
        _size = Raster::create(depth_local,format_local,numLevels_local,local_480,0);
        Raster::lock(_size,idx._4_4_,5);
      }
      Raster::setFromImage(_size,pIStack_440,0);
      Raster::unlock(_size,idx._4_4_);
    }
    else {
      (*_height_local->_vptr_Stream[5])(_height_local,(ulong)(uint32)idx,1);
    }
  }
  (*DAT_00168638)(img);
  Image::destroy(pIStack_440);
  return _size;
}

Assistant:

Raster*
readAsImage(Stream *stream, int32 width, int32 height, int32 depth, int32 format, int32 numLevels)
{
	uint8 palette[256*4];
	int32 pallen = 0;
	uint8 *data = nil;

	Image *img = Image::create(width, height, 32);
	img->allocate();

	if(format & Raster::PAL4){
		pallen = 16;
		stream->read8(palette, 4*32);
	}else if(format & Raster::PAL8){
		pallen = 256;
		stream->read8(palette, 4*256);
	}
	if(!Raster::formatHasAlpha(format))
		for(int32 i = 0; i < pallen; i++)
			palette[i*4+3] = 0xFF;

	Raster *ras = nil;

	for(int i = 0; i < numLevels; i++){
		uint32 size = stream->readU32();

		// don't read levels that don't exist
		if(ras && i >= ras->getNumLevels()){
			stream->seek(size);
			continue;
		}

		// one allocation is enough, first level is largest
		if(data == nil)
			data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_IMAGE);
		stream->read8(data, size);

		if(ras){
			ras->lock(i, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
			img->width = ras->width;
			img->height = ras->height;
			img->stride = img->width*img->bpp;
		}

		if(format & (Raster::PAL4 | Raster::PAL8)){
			uint8 *idx = data;
			uint8 *pixels = img->pixels;
			for(int y = 0; y < img->height; y++){
				uint8 *line = pixels;
				for(int x = 0; x < img->width; x++){
					line[0] = palette[*idx*4+0];
					line[1] = palette[*idx*4+1];
					line[2] = palette[*idx*4+2];
					line[3] = palette[*idx*4+3];
					line += img->bpp;
					idx++;
				}
				pixels += img->stride;
			}
		}

		if(ras == nil){
			// Important to have filled the image with data
			int32 newformat;
			Raster::imageFindRasterFormat(img, format&7, &width, &height, &depth, &newformat);
			newformat |= format & (Raster::MIPMAP | Raster::AUTOMIPMAP);
			ras = Raster::create(width, height, depth, newformat);
			ras->lock(i, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		}

		ras->setFromImage(img);
		ras->unlock(i);
	}

	rwFree(data);
	img->destroy();
	return ras;
}